

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse_array(parser *this,lexer *l,size_t nesting_depth)

{
  _func_int **st;
  token_type tVar1;
  json *this_00;
  token *ptVar2;
  vector<std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::allocator<std::unique_ptr<argo::json,std::default_delete<argo::json>>>>
  *pvVar3;
  json_parser_exception *pjVar4;
  string *s;
  size_t sVar5;
  _func_int **in_RCX;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> local_40;
  _Head_base<0UL,_argo::json_*,_false> local_38;
  
  local_38._M_head_impl = (json *)this;
  if ((l->m_token)._vptr_token < in_RCX) {
    pjVar4 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    st = (l->m_token)._vptr_token;
    sVar5 = reader::get_byte_index((reader *)l->_vptr_lexer);
    json_parser_exception::json_parser_exception
              (pjVar4,maximum_nesting_depth_exceeded_e,(size_t)st,sVar5);
    __cxa_throw(pjVar4,&json_parser_exception::typeinfo,std::exception::~exception);
  }
  this_00 = (json *)operator_new(0x58);
  json::json(this_00,array_e);
  *(json **)local_38._M_head_impl = this_00;
  ptVar2 = lexer::next((lexer *)nesting_depth);
  tVar1 = token::get_type(ptVar2);
  if (tVar1 != end_array_e) {
    lexer::put_back_last((lexer *)nesting_depth);
    pvVar3 = (vector<std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::allocator<std::unique_ptr<argo::json,std::default_delete<argo::json>>>>
              *)json::get_array(this_00);
    parse_value((parser *)&local_40,l,nesting_depth);
    std::
    vector<std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::allocator<std::unique_ptr<argo::json,std::default_delete<argo::json>>>>
    ::emplace_back<std::unique_ptr<argo::json,std::default_delete<argo::json>>>(pvVar3,&local_40);
    while( true ) {
      std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&local_40);
      ptVar2 = lexer::next((lexer *)nesting_depth);
      tVar1 = token::get_type(ptVar2);
      if (tVar1 != value_separator_e) break;
      pvVar3 = (vector<std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::allocator<std::unique_ptr<argo::json,std::default_delete<argo::json>>>>
                *)json::get_array(this_00);
      parse_value((parser *)&local_40,l,nesting_depth);
      std::
      vector<std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::allocator<std::unique_ptr<argo::json,std::default_delete<argo::json>>>>
      ::emplace_back<std::unique_ptr<argo::json,std::default_delete<argo::json>>>(pvVar3,&local_40);
    }
    tVar1 = token::get_type(ptVar2);
    if (tVar1 != end_array_e) {
      pjVar4 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
      s = token::get_raw_value_abi_cxx11_(ptVar2);
      sVar5 = reader::get_byte_index((reader *)l->_vptr_lexer);
      json_parser_exception::json_parser_exception(pjVar4,unexpected_token_e,s,sVar5);
      __cxa_throw(pjVar4,&json_parser_exception::typeinfo,std::exception::~exception);
    }
  }
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (tuple<argo::json_*,_std::default_delete<argo::json>_>)local_38._M_head_impl;
}

Assistant:

unique_ptr<json> parser::parse_array(lexer &l, size_t nesting_depth)
{
    if (nesting_depth > m_max_nesting_depth)
    {
        throw json_parser_exception(
                            json_parser_exception::maximum_nesting_depth_exceeded_e,
                            m_max_nesting_depth,
                            m_reader.get_byte_index());
    }

    unique_ptr<json> array = unique_ptr<json>(new json(json::array_e));

    const token &t1 = l.next();

    if (t1.get_type() == token::end_array_e)
    {
        return array;
    }
    else
    {
        l.put_back_last();
        array->get_array().push_back(parse_value(l, nesting_depth));
    }

    while (true)
    {
        const token &t2 = l.next();

        if (t2.get_type() == token::value_separator_e)
        {
            array->get_array().push_back(parse_value(l, nesting_depth));
        }
        else if (t2.get_type() == token::end_array_e)
        {
            return array;
        }
        else
        {
            throw json_parser_exception(
                            json_parser_exception::unexpected_token_e,
                            t2.get_raw_value(),
                            m_reader.get_byte_index());
        }
    }
    
    return array;
}